

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadArgumentElimination.cpp
# Opt level: O0

bool __thiscall wasm::DAE::iteration(DAE *this,Module *module)

{
  __node_base_ptr *pp_Var1;
  Index x;
  type ppEVar2;
  initializer_list<wasm::Function_*> __l;
  initializer_list<wasm::Function_*> __l_00;
  __node_base_ptr p_Var3;
  bool bVar4;
  bool bVar5;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *pvVar6;
  reference this_00;
  reference this_01;
  pointer pEVar7;
  PassRunner *pPVar8;
  reference __in;
  type *ptVar9;
  vector<wasm::Call*,std::allocator<wasm::Call*>> *this_02;
  iterator __first;
  iterator __last;
  reference __x;
  reference __in_00;
  type *__k;
  type *pppEVar10;
  mapped_type *pppEVar11;
  reference __in_01;
  type *__k_00;
  type *calls_00;
  Function *pFVar12;
  reference puVar13;
  pointer pFVar14;
  mapped_type *pmVar15;
  size_type sVar16;
  pointer ppVar17;
  pointer local_6d8;
  DAE *local_6d0;
  Call **local_6c8;
  __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
  local_6c0;
  undefined1 local_6b1;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *pvStack_6b0;
  bool allDropped;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *calls_4;
  _Self local_6a0;
  iterator iter;
  Name name_4;
  Type local_680;
  reference local_678;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_3;
  iterator __end3_4;
  iterator __begin3_4;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range3_4;
  vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> local_648;
  SortedVector local_628;
  allocator<wasm::Function_*> local_609;
  Function *local_608;
  iterator local_600;
  size_type local_5f8;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> local_5f0;
  undefined1 local_5d8 [8];
  SortedVector removedIndexes;
  size_t numParams;
  Function *local_5a8;
  Function *func_2;
  type *calls_3;
  type *name_3;
  _Self local_588;
  iterator __end2_4;
  iterator __begin2_4;
  map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  *__range2_4;
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  changed;
  iterator iStack_3f0;
  uint i;
  iterator __end3_3;
  iterator __begin3_3;
  SortedVector *__range3_3;
  pointer ppCStack_3d0;
  pointer local_3c8;
  allocator<wasm::Function_*> local_3b1;
  Function *local_3b0;
  iterator local_3a8;
  size_type local_3a0;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> local_398;
  undefined1 local_380 [8];
  SortedVector optimizedIndexes;
  Function *func_1;
  type *calls_2;
  type *name_2;
  _Self local_338;
  iterator __end2_3;
  iterator __begin2_3;
  map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  *__range2_3;
  bool refinedReturnTypes;
  type *calls_1;
  type *name_1;
  _Node_iterator_base<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false> local_300;
  iterator __end3_2;
  iterator __begin3_2;
  unordered_map<wasm::Call_*,_wasm::Expression_**,_std::hash<wasm::Call_*>,_std::equal_to<wasm::Call_*>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>_>
  *__range3_2;
  Name *callee;
  iterator __end3_1;
  iterator __begin3_1;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  *__range3_1;
  __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
  local_2a0;
  const_iterator local_298;
  vector<wasm::Call*,std::allocator<wasm::Call*>> *local_290;
  mapped_type *allCallsToName;
  type *calls;
  type *name;
  _Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_true>
  local_270;
  iterator __end3;
  iterator __begin3;
  unordered_map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  *__range3;
  type *info;
  type *_;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_true> local_240;
  iterator __end2_2;
  iterator __begin2_2;
  DAEFunctionInfoMap *__range2_2;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  tailCallees;
  map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  allCalls;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2_1;
  DAEScanner scanner;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2;
  DAEFunctionInfoMap infoMap;
  Module *module_local;
  DAE *this_local;
  
  infoMap._M_h._M_single_bucket = (__node_base_ptr)module;
  std::
  unordered_map<wasm::Call_*,_wasm::Expression_**,_std::hash<wasm::Call_*>,_std::equal_to<wasm::Call_*>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>_>
  ::clear(&this->allDroppedCalls);
  std::
  unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
  ::unordered_map((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                   *)&__range2);
  pvVar6 = (vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            *)(infoMap._M_h._M_single_bucket + 3);
  __end2 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin(pvVar6);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end(pvVar6);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                     *)&func), bVar4) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
              ::operator*(&__end2);
    pFVar14 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                        (this_00);
    std::
    unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
    ::operator[]((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                  *)&__range2,(key_type *)pFVar14);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end2);
  }
  DAEScanner::DAEScanner((DAEScanner *)&__range2_1,(DAEFunctionInfoMap *)&__range2);
  Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>::walkModuleCode
            ((Walker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_> *)
             ((long)&scanner.
                     super_WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
                     .super_Pass.name.field_2 + 8),(Module *)infoMap._M_h._M_single_bucket);
  p_Var3 = infoMap._M_h._M_single_bucket;
  __end2_1 = std::
             vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ::begin((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      *)infoMap._M_h._M_single_bucket);
  curr = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
         std::
         vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ::end((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                *)p_Var3);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                             *)&curr), bVar4) {
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
              ::operator*(&__end2_1);
    pEVar7 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->(this_01);
    if (pEVar7->kind == Function) {
      pEVar7 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (this_01);
      pmVar15 = std::
                unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                ::operator[]((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                              *)&__range2,&pEVar7->value);
      std::atomic<bool>::operator=(&pmVar15->hasUnseenCalls,true);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
    ::operator++(&__end2_1);
  }
  pPVar8 = Pass::getPassRunner(&this->super_Pass);
  WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>::run
            ((WalkerPass<wasm::PostWalker<wasm::DAEScanner,_wasm::Visitor<wasm::DAEScanner,_void>_>_>
              *)&__range2_1,pPVar8,(Module *)infoMap._M_h._M_single_bucket);
  std::
  map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  ::map((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
         *)&tailCallees._M_h._M_single_bucket);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&__range2_2);
  __end2_2 = std::
             unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
             ::begin((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                      *)&__range2);
  local_240._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
       ::end((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
              *)&__range2);
  while (bVar4 = std::__detail::operator!=
                           (&__end2_2.
                             super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_true>
                            ,&local_240), bVar4) {
    __in = std::__detail::
           _Node_iterator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_false,_true>::
           operator*(&__end2_2);
    std::get<0ul,wasm::Name_const,wasm::DAEFunctionInfo>(__in);
    ptVar9 = std::get<1ul,wasm::Name_const,wasm::DAEFunctionInfo>(__in);
    __end3 = std::
             unordered_map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
             ::begin(&ptVar9->calls);
    local_270._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
         ::end(&ptVar9->calls);
    while (bVar4 = std::__detail::operator!=
                             (&__end3.
                               super__Node_iterator_base<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_true>
                              ,&local_270), bVar4) {
      name = &std::__detail::
              _Node_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_false,_true>
              ::operator*(&__end3)->first;
      calls = (type *)std::
                      get<0ul,wasm::Name_const,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>
                                ((pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                  *)name);
      allCallsToName =
           std::get<1ul,wasm::Name_const,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>
                     ((pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                       *)name);
      this_02 = (vector<wasm::Call*,std::allocator<wasm::Call*>> *)
                std::
                map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                ::operator[]((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                              *)&tailCallees._M_h._M_single_bucket,(key_type *)calls);
      local_290 = this_02;
      local_2a0._M_current =
           (Call **)std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end
                              ((vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)this_02);
      __gnu_cxx::
      __normal_iterator<wasm::Call*const*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>::
      __normal_iterator<wasm::Call**>
                ((__normal_iterator<wasm::Call*const*,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>
                  *)&local_298,&local_2a0);
      __first = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::begin(allCallsToName);
      __last = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end(allCallsToName);
      std::vector<wasm::Call*,std::allocator<wasm::Call*>>::
      insert<__gnu_cxx::__normal_iterator<wasm::Call**,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>,void>
                (this_02,local_298,
                 (__normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                  )__first._M_current,
                 (__normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                  )__last._M_current);
      std::__detail::
      _Node_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>,_false,_true>
      ::operator++(&__end3);
    }
    __end3_1 = std::
               unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
               ::begin(&ptVar9->tailCallees);
    callee = (Name *)std::
                     unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     ::end(&ptVar9->tailCallees);
    while (bVar4 = std::__detail::operator!=
                             (&__end3_1.super__Node_iterator_base<wasm::Name,_true>,
                              (_Node_iterator_base<wasm::Name,_true> *)&callee), bVar4) {
      __x = std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator*(&__end3_1);
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                *)&__range2_2,__x);
      std::__detail::_Node_iterator<wasm::Name,_true,_true>::operator++(&__end3_1);
    }
    __end3_2 = std::
               unordered_map<wasm::Call_*,_wasm::Expression_**,_std::hash<wasm::Call_*>,_std::equal_to<wasm::Call_*>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>_>
               ::begin(&ptVar9->droppedCalls);
    local_300._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Call_*,_wasm::Expression_**,_std::hash<wasm::Call_*>,_std::equal_to<wasm::Call_*>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>_>
         ::end(&ptVar9->droppedCalls);
    while (bVar4 = std::__detail::operator!=
                             (&__end3_2.
                               super__Node_iterator_base<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false>
                              ,&local_300), bVar4) {
      __in_00 = std::__detail::
                _Node_iterator<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false,_false>::
                operator*(&__end3_2);
      __k = std::get<0ul,wasm::Call*const,wasm::Expression**>(__in_00);
      pppEVar10 = std::get<1ul,wasm::Call*const,wasm::Expression**>(__in_00);
      ppEVar2 = *pppEVar10;
      pppEVar11 = std::
                  unordered_map<wasm::Call_*,_wasm::Expression_**,_std::hash<wasm::Call_*>,_std::equal_to<wasm::Call_*>,_std::allocator<std::pair<wasm::Call_*const,_wasm::Expression_**>_>_>
                  ::operator[](&this->allDroppedCalls,__k);
      *pppEVar11 = ppEVar2;
      std::__detail::_Node_iterator<std::pair<wasm::Call_*const,_wasm::Expression_**>,_false,_false>
      ::operator++(&__end3_2);
    }
    std::__detail::_Node_iterator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>,_false,_true>::
    operator++(&__end2_2);
  }
  bVar4 = false;
  pp_Var1 = &tailCallees._M_h._M_single_bucket;
  __end2_3 = std::
             map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
             ::begin((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                      *)pp_Var1);
  local_338._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
       ::end((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
              *)pp_Var1);
  while (bVar5 = std::operator!=(&__end2_3,&local_338), bVar5) {
    __in_01 = std::
              _Rb_tree_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>
              ::operator*(&__end2_3);
    __k_00 = std::get<0ul,wasm::Name_const,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>
                       (__in_01);
    calls_00 = std::get<1ul,wasm::Name_const,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>
                         (__in_01);
    pmVar15 = std::
              unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
              ::operator[]((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                            *)&__range2,__k_00);
    bVar5 = std::atomic::operator_cast_to_bool((atomic *)&pmVar15->hasUnseenCalls);
    if (!bVar5) {
      optimizedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(__k_00->super_IString).str._M_len;
      pFVar12 = Module::getFunction((Module *)infoMap._M_h._M_single_bucket,
                                    (Name)(__k_00->super_IString).str);
      p_Var3 = infoMap._M_h._M_single_bucket;
      pmVar15 = std::
                unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                ::operator[]((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                              *)&__range2,__k_00);
      refineArgumentTypes(this,pFVar12,calls_00,(Module *)p_Var3,pmVar15);
      bVar5 = refineReturnTypes(this,pFVar12,calls_00,(Module *)infoMap._M_h._M_single_bucket);
      if (bVar5) {
        bVar4 = true;
      }
      local_3a8 = &local_3b0;
      local_3a0 = 1;
      local_3b0 = pFVar12;
      std::allocator<wasm::Function_*>::allocator(&local_3b1);
      __l_00._M_len = local_3a0;
      __l_00._M_array = local_3a8;
      std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                (&local_398,__l_00,&local_3b1);
      __range3_3 = (SortedVector *)0x0;
      ppCStack_3d0 = (pointer)0x0;
      local_3c8 = (pointer)0x0;
      std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::vector
                ((vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)&__range3_3);
      ParamUtils::applyConstantValues
                ((SortedVector *)local_380,&local_398,calls_00,
                 (vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)&__range3_3,
                 (Module *)infoMap._M_h._M_single_bucket);
      std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::~vector
                ((vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)&__range3_3);
      std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~vector(&local_398);
      std::allocator<wasm::Function_*>::~allocator(&local_3b1);
      __end3_3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_380);
      iStack_3f0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_380);
      while (bVar5 = __gnu_cxx::operator!=(&__end3_3,&stack0xfffffffffffffc10), bVar5) {
        puVar13 = __gnu_cxx::
                  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&__end3_3);
        x = *puVar13;
        pmVar15 = std::
                  unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                  ::operator[]((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                                *)&__range2,__k_00);
        SortedVector::insert(&pmVar15->unusedParams,x);
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end3_3);
      }
      SortedVector::~SortedVector((SortedVector *)local_380);
    }
    std::
    _Rb_tree_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>
    ::operator++(&__end2_3);
  }
  if (bVar4 != false) {
    ReFinalize::ReFinalize((ReFinalize *)&changed._M_h._M_single_bucket);
    pPVar8 = Pass::getPassRunner(&this->super_Pass);
    WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
           *)&changed._M_h._M_single_bucket,pPVar8,(Module *)infoMap._M_h._M_single_bucket);
    ReFinalize::~ReFinalize((ReFinalize *)&changed._M_h._M_single_bucket);
  }
  std::
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  ::unordered_set((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                   *)&__range2_4);
  pp_Var1 = &tailCallees._M_h._M_single_bucket;
  __end2_4 = std::
             map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
             ::begin((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                      *)pp_Var1);
  local_588._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
       ::end((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
              *)pp_Var1);
  while (bVar5 = std::operator!=(&__end2_4,&local_588), bVar5) {
    name_3 = &std::
              _Rb_tree_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>
              ::operator*(&__end2_4)->first;
    calls_3 = (type *)std::
                      get<0ul,wasm::Name_const,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>
                                ((pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                  *)name_3);
    func_2 = (Function *)
             std::get<1ul,wasm::Name_const,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>
                       ((pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                         *)name_3);
    pmVar15 = std::
              unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
              ::operator[]((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                            *)&__range2,(key_type *)calls_3);
    bVar5 = std::atomic::operator_cast_to_bool((atomic *)&pmVar15->hasUnseenCalls);
    if (!bVar5) {
      local_5a8 = Module::getFunction((Module *)infoMap._M_h._M_single_bucket,
                                      (IString)*(IString *)
                                                &(calls_3->
                                                 super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>
                                                 )._M_impl.super__Vector_impl_data);
      removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)Function::getNumParams(local_5a8);
      if (removedIndexes.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        local_608 = local_5a8;
        local_600 = &local_608;
        local_5f8 = 1;
        std::allocator<wasm::Function_*>::allocator(&local_609);
        __l._M_len = local_5f8;
        __l._M_array = local_600;
        std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::vector
                  (&local_5f0,__l,&local_609);
        pmVar15 = std::
                  unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                  ::operator[]((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                                *)&__range2,(key_type *)calls_3);
        SortedVector::SortedVector(&local_628,&pmVar15->unusedParams);
        pFVar12 = func_2;
        local_648.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_648.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_648.super__Vector_base<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::vector(&local_648);
        p_Var3 = infoMap._M_h._M_single_bucket;
        pPVar8 = Pass::getPassRunner(&this->super_Pass);
        ParamUtils::removeParameters
                  ((SortedVector *)local_5d8,&local_5f0,&local_628,
                   (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)pFVar12,&local_648,
                   (Module *)p_Var3,pPVar8);
        std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::~vector(&local_648);
        SortedVector::~SortedVector(&local_628);
        std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~vector(&local_5f0);
        std::allocator<wasm::Function_*>::~allocator(&local_609);
        bVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_5d8);
        if (!bVar5) {
          std::
          unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
          ::insert((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                    *)&__range2_4,&local_5a8);
        }
        SortedVector::~SortedVector((SortedVector *)local_5d8);
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>
    ::operator++(&__end2_4);
  }
  bVar5 = std::
          unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
          ::empty((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                   *)&__range2_4);
  if (bVar5) {
    pvVar6 = (vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              *)(infoMap._M_h._M_single_bucket + 3);
    __end3_4 = std::
               vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ::begin(pvVar6);
    func_3 = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
             std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::end(pvVar6);
    while (bVar5 = __gnu_cxx::operator!=
                             (&__end3_4,
                              (__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                               *)&func_3), bVar5) {
      local_678 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                  ::operator*(&__end3_4);
      pFVar14 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                          (local_678);
      local_680 = Function::getResults(pFVar14);
      name_4.super_IString.str._M_str._4_4_ = 0;
      bVar5 = wasm::Type::operator==
                        (&local_680,(BasicType *)((long)&name_4.super_IString.str._M_str + 4));
      if (!bVar5) {
        pFVar14 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                            (local_678);
        iter._M_node = (_Base_ptr)
                       (pFVar14->super_Importable).super_Named.name.super_IString.str._M_len;
        name_4.super_IString.str._M_len =
             (size_t)(pFVar14->super_Importable).super_Named.name.super_IString.str._M_str;
        pmVar15 = std::
                  unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                  ::operator[]((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                                *)&__range2,(key_type *)&iter);
        bVar5 = std::atomic::operator_cast_to_bool((atomic *)&pmVar15->hasUnseenCalls);
        if (((!bVar5) &&
            (pmVar15 = std::
                       unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                       ::operator[]((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                                     *)&__range2,(key_type *)&iter),
            (pmVar15->hasTailCalls & 1U) == 0)) &&
           (sVar16 = std::
                     unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     ::count((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                              *)&__range2_2,(key_type *)&iter), sVar16 == 0)) {
          local_6a0._M_node =
               (_Base_ptr)
               std::
               map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
               ::find((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                       *)&tailCallees._M_h._M_single_bucket,(key_type *)&iter);
          calls_4 = (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)
                    std::
                    map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                    ::end((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
                           *)&tailCallees._M_h._M_single_bucket);
          bVar5 = std::operator==(&local_6a0,(_Self *)&calls_4);
          if (!bVar5) {
            ppVar17 = std::
                      _Rb_tree_iterator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>
                      ::operator->(&local_6a0);
            pvStack_6b0 = &ppVar17->second;
            local_6c0._M_current =
                 (Call **)std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::begin
                                    (pvStack_6b0);
            local_6c8 = (Call **)std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end
                                           (pvStack_6b0);
            local_6d0 = this;
            local_6b1 = std::
                        all_of<__gnu_cxx::__normal_iterator<wasm::Call**,std::vector<wasm::Call*,std::allocator<wasm::Call*>>>,wasm::DAE::iteration(wasm::Module*)::_lambda(wasm::Call*)_1_>
                                  (local_6c0,
                                   (__normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                    )local_6c8,(anon_class_8_1_8991fb9c)this);
            if ((bool)local_6b1) {
              pFVar14 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                                  (local_678);
              removeReturnValue(this,pFVar14,pvStack_6b0,(Module *)infoMap._M_h._M_single_bucket);
              local_6d8 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                                    (local_678);
              std::
              unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
              ::insert((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                        *)&__range2_4,&local_6d8);
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
      ::operator++(&__end3_4);
    }
  }
  if (((this->optimize & 1U) != 0) &&
     (bVar5 = std::
              unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
              ::empty((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                       *)&__range2_4), p_Var3 = infoMap._M_h._M_single_bucket, !bVar5)) {
    pPVar8 = Pass::getPassRunner(&this->super_Pass);
    OptUtils::optimizeAfterInlining
              ((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                *)&__range2_4,(Module *)p_Var3,pPVar8);
  }
  bVar5 = std::
          unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
          ::empty((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                   *)&__range2_4);
  if (!bVar5) {
    bVar4 = true;
  }
  std::
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  ::~unordered_set((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                    *)&__range2_4);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)&__range2_2);
  std::
  map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
  ::~map((map<wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>_>_>
          *)&tailCallees._M_h._M_single_bucket);
  DAEScanner::~DAEScanner((DAEScanner *)&__range2_1);
  std::
  unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
  ::~unordered_map((unordered_map<wasm::Name,_wasm::DAEFunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::DAEFunctionInfo>_>_>
                    *)&__range2);
  return bVar4;
}

Assistant:

bool iteration(Module* module) {
    allDroppedCalls.clear();

    DAEFunctionInfoMap infoMap;
    // Ensure they all exist so the parallel threads don't modify the data
    // structure.
    for (auto& func : module->functions) {
      infoMap[func->name];
    }
    DAEScanner scanner(&infoMap);
    scanner.walkModuleCode(module);
    for (auto& curr : module->exports) {
      if (curr->kind == ExternalKind::Function) {
        infoMap[curr->value].hasUnseenCalls = true;
      }
    }
    // Scan all the functions.
    scanner.run(getPassRunner(), module);
    // Combine all the info.
    std::map<Name, std::vector<Call*>> allCalls;
    std::unordered_set<Name> tailCallees;
    for (auto& [_, info] : infoMap) {
      for (auto& [name, calls] : info.calls) {
        auto& allCallsToName = allCalls[name];
        allCallsToName.insert(allCallsToName.end(), calls.begin(), calls.end());
      }
      for (auto& callee : info.tailCallees) {
        tailCallees.insert(callee);
      }
      for (auto& [name, calls] : info.droppedCalls) {
        allDroppedCalls[name] = calls;
      }
    }
    // If we refine return types then we will need to do more type updating
    // at the end.
    bool refinedReturnTypes = false;
    // We now have a mapping of all call sites for each function, and can look
    // for optimization opportunities.
    for (auto& [name, calls] : allCalls) {
      // We can only optimize if we see all the calls and can modify them.
      if (infoMap[name].hasUnseenCalls) {
        continue;
      }
      auto* func = module->getFunction(name);
      // Refine argument types before doing anything else. This does not
      // affect whether an argument is used or not, it just refines the type
      // where possible.
      refineArgumentTypes(func, calls, module, infoMap[name]);
      // Refine return types as well.
      if (refineReturnTypes(func, calls, module)) {
        refinedReturnTypes = true;
      }
      auto optimizedIndexes =
        ParamUtils::applyConstantValues({func}, calls, {}, module);
      for (auto i : optimizedIndexes) {
        // Mark it as unused, which we know it now is (no point to re-scan just
        // for that).
        infoMap[name].unusedParams.insert(i);
      }
    }
    if (refinedReturnTypes) {
      // Changing a call expression's return type can propagate out to its
      // parents, and so we must refinalize.
      // TODO: We could track in which functions we actually make changes.
      ReFinalize().run(getPassRunner(), module);
    }
    // Track which functions we changed, and optimize them later if necessary.
    std::unordered_set<Function*> changed;
    // We now know which parameters are unused, and can potentially remove them.
    for (auto& [name, calls] : allCalls) {
      if (infoMap[name].hasUnseenCalls) {
        continue;
      }
      auto* func = module->getFunction(name);
      auto numParams = func->getNumParams();
      if (numParams == 0) {
        continue;
      }
      auto removedIndexes = ParamUtils::removeParameters(
        {func}, infoMap[name].unusedParams, calls, {}, module, getPassRunner());
      if (!removedIndexes.empty()) {
        // Success!
        changed.insert(func);
      }
    }
    // We can also tell which calls have all their return values dropped. Note
    // that we can't do this if we changed anything so far, as we may have
    // modified allCalls (we can't modify a call site twice in one iteration,
    // once to remove a param, once to drop the return value).
    if (changed.empty()) {
      for (auto& func : module->functions) {
        if (func->getResults() == Type::none) {
          continue;
        }
        auto name = func->name;
        if (infoMap[name].hasUnseenCalls) {
          continue;
        }
        if (infoMap[name].hasTailCalls) {
          continue;
        }
        if (tailCallees.count(name)) {
          continue;
        }
        auto iter = allCalls.find(name);
        if (iter == allCalls.end()) {
          continue;
        }
        auto& calls = iter->second;
        bool allDropped =
          std::all_of(calls.begin(), calls.end(), [&](Call* call) {
            return allDroppedCalls.count(call);
          });
        if (!allDropped) {
          continue;
        }
        removeReturnValue(func.get(), calls, module);
        // TODO Removing a drop may also open optimization opportunities in the
        // callers.
        changed.insert(func.get());
      }
    }
    if (optimize && !changed.empty()) {
      OptUtils::optimizeAfterInlining(changed, module, getPassRunner());
    }
    return !changed.empty() || refinedReturnTypes;
  }